

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# icosahedron.h
# Opt level: O2

void icosahedron<Eigen::Matrix<float,_1,3,1,_1,3>,Eigen::Matrix<unsigned_int,_1,3,1,_1,3>>
               (PlainObjectBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *V,
               PlainObjectBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *F)

{
  CommaInitializer<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *pCVar1;
  DenseBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *other;
  CommaInitializer<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *pCVar2;
  DenseBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *other_00;
  Scalar local_144;
  Scalar local_140;
  Scalar local_13c;
  Scalar local_138;
  Scalar local_134;
  Scalar local_130;
  Scalar local_12c;
  Scalar local_128;
  Scalar local_124;
  Scalar local_120;
  Scalar local_11c;
  Scalar local_118;
  Scalar local_114;
  Scalar local_110;
  Scalar local_10c;
  Scalar local_108;
  Scalar local_104;
  Scalar local_100;
  Scalar local_fc;
  Scalar local_f8;
  Scalar local_f4;
  Scalar local_f0;
  Scalar local_ec;
  Scalar local_e8;
  Scalar local_e4;
  Scalar local_e0;
  Scalar local_dc;
  Scalar local_d8;
  Scalar local_d4;
  Scalar local_d0;
  Scalar local_cc;
  Scalar local_c8;
  Scalar local_c4;
  Scalar local_c0;
  Scalar local_bc;
  int local_b8 [2];
  undefined4 *local_b0 [2];
  Scalar local_a0 [24];
  CommaInitializer<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> local_40;
  
  local_b8[1] = 0xc;
  local_b8[0] = 3;
  Eigen::Matrix<float,-1,3,1,-1,3>::Matrix<int,int>
            ((Matrix<float,_1,3,1,_1,3> *)local_b0,local_b8 + 1,local_b8);
  local_40.m_row = 0;
  local_40.m_col = 1;
  local_40.m_currentBlockRows = 1;
  *local_b0[0] = 0;
  local_bc = 0.0;
  local_40.m_xpr = (Matrix<float,__1,_3,_1,__1,_3> *)local_b0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (&local_40,&local_bc);
  local_c0 = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_c0);
  local_c4 = 0.7236068;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_c4);
  local_c8 = -0.5257311;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_c8);
  local_cc = 0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_cc);
  local_d0 = 0.7236068;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_d0);
  local_d4 = 0.5257311;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_d4);
  local_d8 = 0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_d8);
  local_dc = -0.2763932;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_dc);
  local_e0 = 0.8506508;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_e0);
  local_e4 = 0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_e4);
  local_e8 = -0.8944272;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_e8);
  local_ec = 1.0953574e-16;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_ec);
  local_f0 = 0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_f0);
  local_f4 = -0.2763932;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_f4);
  local_f8 = -0.8506508;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_f8);
  local_fc = 0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_fc);
  local_100 = 0.8944272;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_100);
  local_104 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_104);
  local_108 = -0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_108);
  local_10c = 0.2763932;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_10c);
  local_110 = 0.8506508;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_110);
  local_114 = -0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_114);
  local_118 = -0.7236068;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_118);
  local_11c = 0.5257311;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_11c);
  local_120 = -0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_120);
  local_124 = -0.7236068;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_124);
  local_128 = -0.5257311;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_128);
  local_12c = -0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_12c);
  local_130 = 0.2763932;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_130);
  local_134 = -0.8506508;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_134);
  local_138 = -0.4472136;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_138);
  local_13c = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_13c);
  local_140 = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_140);
  local_144 = -1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar1,&local_144);
  other = (DenseBase<Eigen::Matrix<float,__1,_3,_1,__1,_3>_> *)
          Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::finished(pCVar1);
  Eigen::PlainObjectBase<Eigen::Matrix<float,-1,3,1,-1,3>>::
  lazyAssign<Eigen::Matrix<float,_1,3,1,_1,3>>
            ((PlainObjectBase<Eigen::Matrix<float,_1,3,1,_1,3>> *)V,other);
  Eigen::CommaInitializer<Eigen::Matrix<float,_-1,_3,_1,_-1,_3>_>::~CommaInitializer(&local_40);
  free(local_b0[0]);
  local_b8[1] = 0x14;
  local_b8[0] = 3;
  Eigen::Matrix<unsigned_int,-1,3,1,-1,3>::Matrix<int,int>
            ((Matrix<unsigned_int,_1,3,1,_1,3> *)local_b0,local_b8 + 1,local_b8);
  local_40.m_row = 0;
  local_40.m_col = 1;
  local_40.m_currentBlockRows = 1;
  *local_b0[0] = 0;
  local_bc = 1.4013e-45;
  local_40.m_xpr = (Matrix<float,__1,_3,_1,__1,_3> *)local_b0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *)&local_40,
                      (Scalar *)&local_bc);
  local_c0 = 2.8026e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_c0);
  local_c4 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_c4);
  local_c8 = 2.8026e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_c8);
  local_cc = 4.2039e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_cc);
  local_d0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_d0);
  local_d4 = 4.2039e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_d4);
  local_d8 = 5.60519e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_d8);
  local_dc = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_dc);
  local_e0 = 5.60519e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_e0);
  local_e4 = 7.00649e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_e4);
  local_e8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_e8);
  local_ec = 7.00649e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_ec);
  local_f0 = 1.4013e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_f0);
  local_f4 = 1.4013e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_f4);
  local_f8 = 8.40779e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_f8);
  local_fc = 2.8026e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_fc);
  local_100 = 2.8026e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_100);
  local_104 = 9.80909e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_104);
  local_108 = 4.2039e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_108);
  local_10c = 4.2039e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_10c);
  local_110 = 1.12104e-44;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_110);
  local_114 = 5.60519e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_114);
  local_118 = 5.60519e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_118);
  local_11c = 1.26117e-44;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_11c);
  local_120 = 7.00649e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_120);
  local_124 = 7.00649e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_124);
  local_128 = 1.4013e-44;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_128);
  local_12c = 1.4013e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_12c);
  local_130 = 8.40779e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_130);
  local_134 = 9.80909e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_134);
  local_138 = 2.8026e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_138);
  local_13c = 9.80909e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_13c);
  local_140 = 1.12104e-44;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_140);
  local_144 = 4.2039e-45;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,(Scalar *)&local_144);
  local_a0[0x17] = 8;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0x17);
  local_a0[0x16] = 9;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0x16);
  local_a0[0x15] = 4;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0x15);
  local_a0[0x14] = 9;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0x14);
  local_a0[0x13] = 10;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0x13);
  local_a0[0x12] = 5;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0x12);
  local_a0[0x11] = 10;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0x11);
  local_a0[0x10] = 6;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0x10);
  local_a0[0xf] = 1;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0xf);
  local_a0[0xe] = 6;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0xe);
  local_a0[0xd] = 0xb;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0xd);
  local_a0[0xc] = 7;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0xc);
  local_a0[0xb] = 7;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 0xb);
  local_a0[10] = 0xb;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 10);
  local_a0[9] = 8;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 9);
  local_a0[8] = 8;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 8);
  local_a0[7] = 0xb;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 7);
  local_a0[6] = 9;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 6);
  local_a0[5] = 9;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 5);
  local_a0[4] = 0xb;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 4);
  local_a0[3] = 10;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 3);
  local_a0[2] = 10;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 2);
  local_a0[1] = 0xb;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0 + 1);
  local_a0[0] = 6;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::operator_
                     (pCVar2,local_a0);
  other_00 = (DenseBase<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *)
             Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::finished
                       (pCVar2);
  Eigen::PlainObjectBase<Eigen::Matrix<unsigned_int,-1,3,1,-1,3>>::
  lazyAssign<Eigen::Matrix<unsigned_int,_1,3,1,_1,3>>
            ((PlainObjectBase<Eigen::Matrix<unsigned_int,_1,3,1,_1,3>> *)F,other_00);
  Eigen::CommaInitializer<Eigen::Matrix<unsigned_int,_-1,_3,_1,_-1,_3>_>::~CommaInitializer
            ((CommaInitializer<Eigen::Matrix<unsigned_int,__1,_3,_1,__1,_3>_> *)&local_40);
  free(local_b0[0]);
  return;
}

Assistant:

inline void icosahedron(
  Eigen::PlainObjectBase<DerivedV> & V,
  Eigen::PlainObjectBase<DerivedF> & F)
{
  V = (DerivedV(12,3) <<
    0,0,1,
    0.72360679774997894,-0.52573111211913359,0.44721359549995793,
    0.72360679774997894,0.52573111211913359,0.44721359549995793,
    -0.27639320225002095,0.85065080835203999,0.44721359549995793,
    -0.89442719099991586,1.0953573965284052e-16,0.44721359549995793,
    -0.27639320225002112,-0.85065080835203988,0.44721359549995793,
    0.89442719099991586,0,-0.44721359549995793,
    0.27639320225002106,0.85065080835203988,-0.44721359549995793,
    -0.72360679774997883,0.5257311121191337,-0.44721359549995793,
    -0.72360679774997894,-0.52573111211913348,-0.44721359549995793,
    0.27639320225002084,-0.85065080835203999,-0.44721359549995793,
    0,0,-1).finished();
  F = (DerivedF(20,3)<<
    0,1,2,
    0,2,3,
    0,3,4,
    0,4,5,
    0,5,1,
    1,6,2,
    2,7,3,
    3,8,4,
    4,9,5,
    5,10,1,
    6,7,2,
    7,8,3,
    8,9,4,
    9,10,5,
    10,6,1,
    6,11,7,
    7,11,8,
    8,11,9,
    9,11,10,
    10,11,6).finished();
}